

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair1_poly.c
# Opt level: O2

void pair1poly_pipe_get_cb(void *arg)

{
  nni_aio *aio;
  nng_err nVar1;
  nni_msg *m;
  
  aio = (nni_aio *)((long)arg + 0x3a8);
  nVar1 = nni_aio_result(aio);
  if (nVar1 != NNG_OK) {
    nni_pipe_close(*arg);
    return;
  }
  m = nni_aio_get_msg(aio);
  nni_aio_set_msg(aio,(nni_msg *)0x0);
  nni_msg_header_clear(m);
  nni_msg_header_append_u32(m,1);
  nni_aio_set_msg((nni_aio *)((long)arg + 0x18),m);
  nni_pipe_send(*arg,(nni_aio *)((long)arg + 0x18));
  return;
}

Assistant:

static void
pair1poly_pipe_get_cb(void *arg)
{
	pair1poly_pipe *p = arg;
	nni_msg        *msg;

	if (nni_aio_result(&p->aio_get) != 0) {
		nni_pipe_close(p->pipe);
		return;
	}

	msg = nni_aio_get_msg(&p->aio_get);
	nni_aio_set_msg(&p->aio_get, NULL);

	// Cooked mode messages have no header, so we have to add one.
	// Strip off any previously existing header, such as when
	// replying to a message.
	nni_msg_header_clear(msg);

	// Insert the hop count header.
	nni_msg_header_append_u32(msg, 1);

	nni_aio_set_msg(&p->aio_send, msg);
	nni_pipe_send(p->pipe, &p->aio_send);
}